

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

bool image_manipulation::bicubic_resize
               (clip_image_u8 *img,clip_image_u8 *dst,int target_width,int target_height)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  pointer puVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float C [5];
  ulong local_d8;
  float local_b8 [6];
  ulong local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  clip_image_u8 *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar2 = img->nx;
  uVar12 = (ulong)uVar2;
  iVar3 = img->ny;
  dst->nx = target_width;
  dst->ny = target_height;
  local_78 = &dst->buf;
  local_80 = img;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_78,(long)(target_width * target_height * 3));
  if (0 < target_height) {
    iVar19 = iVar3 + -1;
    uVar10 = uVar2 - 1;
    local_a0 = (ulong)(uint)target_height;
    local_d8 = 0;
    local_88 = uVar12;
    do {
      if (0 < target_width) {
        fVar21 = (float)(int)local_d8 * ((float)iVar3 / (float)target_height);
        local_70 = (ulong)((int)fVar21 - 1);
        local_98 = local_d8 * (uint)target_width;
        local_90 = 0;
        local_58 = ZEXT416((uint)(fVar21 - (float)(int)fVar21));
        fVar21 = fVar21 - (float)(int)fVar21;
        do {
          uVar11 = 0;
          fVar22 = (float)(int)local_90 * ((float)(int)uVar2 / (float)target_width);
          uVar15 = (uint)fVar22;
          uVar17 = uVar15 - 1;
          if ((int)uVar10 < (int)(uVar15 - 1)) {
            uVar17 = uVar10;
          }
          if ((int)uVar17 < 1) {
            uVar17 = uVar11;
          }
          local_68 = (ulong)uVar17;
          uVar17 = uVar15;
          if ((int)uVar10 < (int)uVar15) {
            uVar17 = uVar10;
          }
          if ((int)uVar17 < 1) {
            uVar17 = uVar11;
          }
          uVar16 = uVar15 + 1;
          if ((int)uVar10 < (int)(uVar15 + 1)) {
            uVar16 = uVar10;
          }
          if ((int)uVar16 < 1) {
            uVar16 = uVar11;
          }
          uVar5 = uVar15 + 2;
          if ((int)uVar10 < (int)(uVar15 + 2)) {
            uVar5 = uVar10;
          }
          if ((int)uVar5 < 1) {
            uVar5 = uVar11;
          }
          local_60 = (local_98 + local_90) * 3;
          lVar14 = 0;
          local_48 = ZEXT416((uint)(fVar22 - (float)(int)fVar22));
          fVar22 = fVar22 - (float)(int)fVar22;
          do {
            lVar18 = 0;
            do {
              iVar9 = (int)local_70 + (int)lVar18;
              if (iVar19 < iVar9) {
                iVar9 = iVar19;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              iVar9 = iVar9 * (int)uVar12;
              iVar13 = (int)lVar14;
              puVar4 = (local_80->buf).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              bVar1 = puVar4[(int)((iVar9 + uVar17) * 3 + iVar13)];
              fVar7 = (float)(int)((uint)puVar4[(iVar9 + (int)local_68) * 3 + iVar13] - (uint)bVar1)
              ;
              fVar8 = (float)(int)((uint)puVar4[(int)((iVar9 + uVar16) * 3 + iVar13)] - (uint)bVar1)
              ;
              fVar6 = (float)(int)((uint)puVar4[(int)((iVar9 + uVar5) * 3 + iVar13)] - (uint)bVar1);
              fVar20 = fVar8 * 0.5;
              local_b8[lVar18] =
                   (fVar6 * 0.16666667 + (fVar7 * -0.16666667 - fVar20)) * fVar22 * fVar22 * fVar22
                   + (fVar7 * 0.5 + fVar20) * fVar22 * fVar22 +
                     (fVar6 * -0.16666667 + fVar7 * -0.33333334 + fVar8) * fVar22 + (float)bVar1;
              fVar20 = local_b8[0] - local_b8[1];
              fVar22 = (local_b8[2] - local_b8[1]) * 0.5;
              fVar22 = roundf(((local_b8[3] - local_b8[1]) * 0.16666667 +
                              (fVar20 * -0.16666667 - fVar22)) * fVar21 * fVar21 * fVar21 +
                              (fVar20 * 0.5 + fVar22) * fVar21 * fVar21 +
                              ((local_b8[3] - local_b8[1]) * -0.16666667 +
                              fVar20 * -0.33333334 + (local_b8[2] - local_b8[1])) * fVar21 +
                              local_b8[1]);
              fVar21 = 0.0;
              if (0.0 <= fVar22) {
                fVar21 = fVar22;
              }
              fVar22 = 255.0;
              if (fVar21 <= 255.0) {
                fVar22 = fVar21;
              }
              (local_78->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[local_60 + lVar14] = (uchar)(int)fVar22;
              lVar18 = lVar18 + 1;
              uVar12 = local_88;
              fVar21 = (float)local_58._0_4_;
              fVar22 = (float)local_48._0_4_;
            } while (lVar18 != 4);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          local_90 = local_90 + 1;
        } while (local_90 != (uint)target_width);
      }
      local_d8 = local_d8 + 1;
    } while (local_d8 != local_a0);
  }
  return true;
}

Assistant:

static bool bicubic_resize(const clip_image_u8 & img, clip_image_u8 & dst, int target_width, int target_height) {
        const int nx = img.nx;
        const int ny = img.ny;

        dst.nx = target_width;
        dst.ny = target_height;
        dst.buf.resize(3 * target_width * target_height);

        float Cc;
        float C[5];
        float d0, d2, d3, a0, a1, a2, a3;
        int i, j, k, jj;
        int x, y;
        float dx, dy;
        float tx, ty;

        tx = (float)nx / (float)target_width;
        ty = (float)ny / (float)target_height;

        // Bicubic interpolation; adapted from ViT.cpp, inspired from :
        //    -> https://github.com/yglukhov/bicubic-interpolation-image-processing/blob/master/libimage.c#L36
        //    -> https://en.wikipedia.org/wiki/Bicubic_interpolation

        for (i = 0; i < target_height; i++) {
            for (j = 0; j < target_width; j++) {
                x = (int)(tx * j);
                y = (int)(ty * i);

                dx = tx * j - x;
                dy = ty * i - y;

                for (k = 0; k < 3; k++) {
                    for (jj = 0; jj <= 3; jj++) {
                        d0 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x - 1, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        d2 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x + 1, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        d3 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x + 2, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        a0 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];

                        a1 = -1.0 / 3 * d0 + d2 - 1.0 / 6 * d3;
                        a2 =  1.0 / 2 * d0 +      1.0 / 2 * d2;
                        a3 = -1.0 / 6 * d0 -      1.0 / 2 * d2 + 1.0 / 6 * d3;

                        C[jj] = a0 + a1 * dx + a2 * dx * dx + a3 * dx * dx * dx;

                        d0 = C[0] - C[1];
                        d2 = C[2] - C[1];
                        d3 = C[3] - C[1];
                        a0 = C[1];
                        a1 = -1.0 / 3 * d0 + d2 - 1.0 / 6 * d3;
                        a2 =  1.0 / 2 * d0 +      1.0 / 2 * d2;
                        a3 = -1.0 / 6 * d0 -      1.0 / 2 * d2 + 1.0 / 6 * d3;
                        Cc = a0 + a1 * dy + a2 * dy * dy + a3 * dy * dy * dy;

                        const uint8_t Cc2 = std::min(std::max(std::round(Cc), 0.0f), 255.0f);
                        dst.buf[(i * target_width + j) * 3 + k] = float(Cc2);
                    }
                }
            }
        }

        return true;
    }